

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::Tastore<int>(VM *this)

{
  int_t value_00;
  int_t iVar1;
  int_t iVar2;
  addr_t addr;
  int_t value;
  VM *this_local;
  
  value_00 = POP<int>(this);
  iVar1 = POP<int>(this);
  iVar2 = POP<int>(this);
  WRITE<int>(this,iVar2 + iVar1,value_00);
  return;
}

Assistant:

void VM::Tastore() {
    auto value = POP<T>();
    addr_t addr = slots_count<T> * POP<addr_t>();
    addr += POP<addr_t>();
    WRITE(addr, value);
}